

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeArrayBufferPrototype
               (DynamicObject *arrayBufferPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *pSVar1;
  undefined8 in_RAX;
  uint uVar3;
  JavascriptString *pJVar2;
  ulong uVar4;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,arrayBufferPrototype,mode,2,0);
  this = (((arrayBufferPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar1 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  uVar4 = (ulong)uVar3 << 0x20;
  (*(arrayBufferPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (arrayBufferPrototype,0x67,
             (this->super_JavascriptLibraryBase).arrayBufferConstructor.ptr,6,0,0,uVar4);
  AddFunctionToLibraryObject
            (this,arrayBufferPrototype,0x150,(FunctionInfo *)ArrayBuffer::EntryInfo::Slice,2,'\x06')
  ;
  AddAccessorsToLibraryObject
            (this,arrayBufferPrototype,0x1a9,
             (FunctionInfo *)ArrayBuffer::EntryInfo::GetterByteLength,(FunctionInfo *)0x0);
  if (((pSVar1->config).threadConfig)->m_ES6ToStringTag == true) {
    pJVar2 = CreateStringFromCppLiteral<12ul>(this,(char16 (*) [12])0xf2e8f2);
    (*(arrayBufferPrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (arrayBufferPrototype,0x1b,pJVar2,2,0,0,uVar4 & 0xffffffff00000000);
  }
  DynamicObject::SetHasNoEnumerableProperties(arrayBufferPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeArrayBufferPrototype(DynamicObject* arrayBufferPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(arrayBufferPrototype, mode, 2);

        ScriptContext* scriptContext = arrayBufferPrototype->GetScriptContext();
        JavascriptLibrary* library = arrayBufferPrototype->GetLibrary();
        library->AddMember(arrayBufferPrototype, PropertyIds::constructor, library->arrayBufferConstructor);

        library->AddFunctionToLibraryObject(arrayBufferPrototype, PropertyIds::slice, &ArrayBuffer::EntryInfo::Slice, 2);
        library->AddAccessorsToLibraryObject(arrayBufferPrototype, PropertyIds::byteLength, &ArrayBuffer::EntryInfo::GetterByteLength, nullptr);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(arrayBufferPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("ArrayBuffer")), PropertyConfigurable);
        }

        arrayBufferPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }